

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransporthttp.c
# Opt level: O2

void IoTHubTransportHttp_DoWork(TRANSPORT_LL_HANDLE handle)

{
  DLIST_ENTRY *ListHead;
  HTTPTRANSPORT_PERDEVICE_DATA *deviceData;
  DLIST_ENTRY_TAG *pDVar1;
  HTTPAPIEX_HANDLE pHVar2;
  HTTPAPIEX_SAS_HANDLE pHVar3;
  _Bool _Var4;
  char cVar5;
  int iVar6;
  HTTP_HEADERS_RESULT HVar7;
  IOTHUBMESSAGE_CONTENT_TYPE IVar8;
  IOTHUB_MESSAGE_RESULT IVar9;
  HTTPAPIEX_RESULT HVar10;
  MAP_RESULT MVar11;
  size_t sVar12;
  undefined8 *puVar13;
  STRING_HANDLE pSVar14;
  LOGGER_LOG UNRECOVERED_JUMPTABLE;
  STRING_HANDLE s2;
  MAP_HANDLE pMVar15;
  PDLIST_ENTRY pDVar16;
  size_t sVar17;
  size_t sVar18;
  time_t stopTime;
  HTTP_HEADERS_HANDLE pHVar19;
  BUFFER_HANDLE pBVar20;
  uchar *puVar21;
  size_t sVar22;
  IOTHUB_MESSAGE_HANDLE iotHubMessageHandle;
  MESSAGE_DISPOSITION_CONTEXT *dispositionContext;
  int iVar23;
  size_t index;
  bool bVar24;
  ulong uVar25;
  char *pcVar26;
  char *pcVar27;
  bool bVar28;
  HTTP_HEADERS_HANDLE index_00;
  ulong uVar29;
  double dVar30;
  HTTP_HEADERS_HANDLE pHVar31;
  STRING_HANDLE local_98;
  uchar *source;
  char *local_70;
  size_t size;
  size_t local_60;
  size_t propertiesSize;
  MAP_HANDLE local_50;
  size_t originalMessageSize;
  uchar *messageContent;
  TRANSPORT_LL_HANDLE local_38;
  
  if (handle == (TRANSPORT_LL_HANDLE)0x0) {
    UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
    if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
      (*UNRECOVERED_JUMPTABLE)
                (AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                 ,"IoTHubTransportHttp_DoWork",0x83d,1,"Invalid Argument NULL call on DoWork.");
      return;
    }
  }
  else {
    sVar12 = VECTOR_size(*(VECTOR_HANDLE *)((long)handle + 0x18));
    local_60 = sVar12;
    local_38 = handle;
    for (index = 0; index != sVar12; index = index + 1) {
      puVar13 = (undefined8 *)VECTOR_element(*(VECTOR_HANDLE *)((long)handle + 0x18),index);
      deviceData = (HTTPTRANSPORT_PERDEVICE_DATA *)*puVar13;
      iVar6 = DList_IsListEmpty(deviceData->waitingToSend);
      if (iVar6 == 0) {
        if (*(char *)((long)handle + 0x10) == '\x01') {
          HVar7 = HTTPHeaders_ReplaceHeaderNameValuePair
                            (deviceData->eventHTTPrequestHeaders,"Content-Type",
                             "application/vnd.microsoft.iothub.json");
          if (HVar7 == HTTP_HEADERS_OK) {
            local_98 = STRING_construct("[");
            if (local_98 != (STRING_HANDLE)0x0) {
              ListHead = &deviceData->eventConfirmations;
              bVar24 = true;
              local_70 = (char *)0x0;
              bVar28 = true;
              iVar6 = 1;
              goto LAB_0012a703;
            }
            UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
            if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
              (*UNRECOVERED_JUMPTABLE)
                        (AZ_LOG_ERROR,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                         ,"makePayload",0x56a,1,"unable to STRING_construct");
            }
            UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
            if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
              iVar6 = 0x629;
              pcVar26 = "unrecoverable errors while building a batch message";
              goto LAB_0012af5c;
            }
          }
          else {
            UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
            if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
              iVar6 = 0x5e5;
              pcVar26 = "unable to HTTPHeaders_ReplaceHeaderNameValuePair";
              goto LAB_0012af5c;
            }
          }
        }
        else {
          messageContent = (uchar *)0x0;
          originalMessageSize = 0;
          pDVar1 = deviceData->waitingToSend->Flink;
          IVar8 = IoTHubMessage_GetContentType((IOTHUB_MESSAGE_HANDLE)pDVar1[-2].Blink);
          if (IVar8 == IOTHUBMESSAGE_STRING) {
            messageContent =
                 (uchar *)IoTHubMessage_GetString((IOTHUB_MESSAGE_HANDLE)pDVar1[-2].Blink);
            if (messageContent != (uchar *)0x0) {
              originalMessageSize = strlen((char *)messageContent);
              goto LAB_0012ac9c;
            }
            originalMessageSize = 0;
          }
          else if ((IVar8 == IOTHUBMESSAGE_BYTEARRAY) &&
                  (IVar9 = IoTHubMessage_GetByteArray
                                     ((IOTHUB_MESSAGE_HANDLE)pDVar1[-2].Blink,&messageContent,
                                      &originalMessageSize), IVar9 == IOTHUB_MESSAGE_OK)) {
LAB_0012ac9c:
            uVar25 = originalMessageSize + 0x180;
            if (uVar25 < 0x3fc00) {
              pHVar19 = HTTPHeaders_Clone(deviceData->eventHTTPrequestHeaders);
              if (pHVar19 == (HTTP_HEADERS_HANDLE)0x0) {
                UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
                if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                  iVar6 = 0x662;
                  pcVar26 = "HTTPHeaders_Clone failed";
                  goto LAB_0012af5c;
                }
              }
              else {
                HVar7 = HTTPHeaders_ReplaceHeaderNameValuePair
                                  (pHVar19,"Content-Type","application/octet-stream");
                if (HVar7 == HTTP_HEADERS_OK) {
                  pMVar15 = IoTHubMessage_Properties((IOTHUB_MESSAGE_HANDLE)pDVar1[-2].Blink);
                  if (pMVar15 == (MAP_HANDLE)0x0) {
                    UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
                    if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                      iVar6 = 299;
                      pcVar26 = "MAP_HANDLE is invalid";
LAB_0012b516:
                      (*UNRECOVERED_JUMPTABLE)
                                (AZ_LOG_ERROR,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                                 ,"set_message_properties",iVar6,1,pcVar26);
                    }
                  }
                  else {
                    MVar11 = Map_GetInternals(pMVar15,(char ***)&source,(char ***)&size,
                                              &propertiesSize);
                    if (MVar11 == MAP_OK) {
                      for (uVar29 = 0; uVar29 < propertiesSize; uVar29 = uVar29 + 1) {
                        sVar17 = strlen(*(char **)(size + uVar29 * 8));
                        pcVar26 = *(char **)(source + uVar29 * 8);
                        sVar18 = strlen(pcVar26);
                        uVar25 = uVar25 + sVar17 + sVar18 + 0x10;
                        if (0x3fbff < uVar25) {
                          pDVar16 = DList_RemoveHeadList(deviceData->waitingToSend);
                          DList_InsertTailList(&deviceData->eventConfirmations,pDVar16);
                          (**(code **)((long)handle + 0x38))
                                    (&deviceData->eventConfirmations,3,
                                     deviceData->device_transport_ctx);
                          sVar12 = local_60;
                          goto LAB_0012b520;
                        }
                        pSVar14 = STRING_construct_sprintf("%s%s","iothub-app-",pcVar26);
                        if (pSVar14 == (STRING_HANDLE)0x0) {
                          UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
                          sVar12 = local_60;
                          if (UNRECOVERED_JUMPTABLE == (LOGGER_LOG)0x0) goto LAB_0012b520;
                          iVar6 = 0x145;
                          pcVar26 = "Unable to construct app header";
                          goto LAB_0012b516;
                        }
                        pcVar26 = STRING_c_str(pSVar14);
                        HVar7 = HTTPHeaders_ReplaceHeaderNameValuePair
                                          (pHVar19,pcVar26,*(char **)(size + uVar29 * 8));
                        if (HVar7 != HTTP_HEADERS_OK) {
                          UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
                          sVar12 = local_60;
                          if (UNRECOVERED_JUMPTABLE == (LOGGER_LOG)0x0) goto LAB_0012b520;
                          iVar6 = 0x14d;
                          pcVar26 = "Unable to add app properties to http header";
                          goto LAB_0012b516;
                        }
                        STRING_delete(pSVar14);
                      }
                      pcVar26 = IoTHubMessage_GetMessageId((IOTHUB_MESSAGE_HANDLE)pDVar1[-2].Blink);
                      if ((pcVar26 == (char *)0x0) ||
                         (HVar7 = HTTPHeaders_ReplaceHeaderNameValuePair
                                            (pHVar19,"iothub-messageid",pcVar26),
                         HVar7 == HTTP_HEADERS_OK)) {
                        pcVar26 = IoTHubMessage_GetCorrelationId
                                            ((IOTHUB_MESSAGE_HANDLE)pDVar1[-2].Blink);
                        sVar12 = local_60;
                        if ((pcVar26 == (char *)0x0) ||
                           (HVar7 = HTTPHeaders_ReplaceHeaderNameValuePair
                                              (pHVar19,"iothub-correlationid",pcVar26),
                           HVar7 == HTTP_HEADERS_OK)) {
                          pcVar26 = IoTHubMessage_GetContentTypeSystemProperty
                                              ((IOTHUB_MESSAGE_HANDLE)pDVar1[-2].Blink);
                          if ((pcVar26 == (char *)0x0) ||
                             (HVar7 = HTTPHeaders_ReplaceHeaderNameValuePair
                                                (pHVar19,"iothub-contenttype",pcVar26),
                             HVar7 == HTTP_HEADERS_OK)) {
                            pcVar26 = IoTHubMessage_GetContentEncodingSystemProperty
                                                ((IOTHUB_MESSAGE_HANDLE)pDVar1[-2].Blink);
                            if ((pcVar26 == (char *)0x0) ||
                               (HVar7 = HTTPHeaders_ReplaceHeaderNameValuePair
                                                  (pHVar19,"iothub-contentencoding",pcVar26),
                               HVar7 == HTTP_HEADERS_OK)) {
                              _Var4 = IoTHubMessage_IsSecurityMessage
                                                ((IOTHUB_MESSAGE_HANDLE)pDVar1[-2].Blink);
                              if ((_Var4) &&
                                 (HVar7 = HTTPHeaders_ReplaceHeaderNameValuePair
                                                    (pHVar19,"iothub-interface-id",
                                                     "urn:azureiot:Security:SecurityAgent:1"),
                                 HVar7 != HTTP_HEADERS_OK)) {
                                UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
                                if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                                  pcVar26 = "set_system_properties";
                                  iVar6 = 0x112;
                                  pcVar27 = "unable to set security message header info";
                                  goto LAB_0012b36f;
                                }
                              }
                              else {
                                pBVar20 = BUFFER_create(messageContent,originalMessageSize);
                                if (pBVar20 == (BUFFER_HANDLE)0x0) {
                                  UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
                                  if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                                    iVar6 = 0x67a;
                                    pcVar26 = "unable to BUFFER_new";
LAB_0012be42:
                                    (*UNRECOVERED_JUMPTABLE)
                                              (AZ_LOG_ERROR,
                                               "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                                               ,"DoEvent",iVar6,1,pcVar26);
                                  }
                                }
                                else {
                                  source = (uchar *)((ulong)source & 0xffffffff00000000);
                                  if (deviceData->deviceSasToken == (STRING_HANDLE)0x0) {
                                    pHVar3 = deviceData->sasObject;
                                    pHVar2 = *(HTTPAPIEX_HANDLE *)((long)handle + 8);
                                    pcVar26 = STRING_c_str(deviceData->eventHTTPrelativePath);
                                    HVar10 = HTTPAPIEX_SAS_ExecuteRequest
                                                       (pHVar3,pHVar2,HTTPAPI_REQUEST_POST,pcVar26,
                                                        pHVar19,pBVar20,(uint *)&source,
                                                        (HTTP_HEADERS_HANDLE)0x0,(BUFFER_HANDLE)0x0)
                                    ;
                                    if (HVar10 != HTTPAPIEX_OK) {
                                      UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
                                      if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                                        iVar6 = 0x693;
                                        pcVar26 = "unable to HTTPAPIEX_SAS_ExecuteRequest";
LAB_0012bdcb:
                                        (*UNRECOVERED_JUMPTABLE)
                                                  (AZ_LOG_ERROR,
                                                                                                      
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                                                  ,"DoEvent",iVar6,1,pcVar26);
                                      }
                                      goto LAB_0012bdd0;
                                    }
LAB_0012bd27:
                                    if ((uint)source < 300) {
                                      pDVar16 = DList_RemoveHeadList(deviceData->waitingToSend);
                                      DList_InsertTailList(&deviceData->eventConfirmations,pDVar16);
                                      (**(code **)((long)handle + 0x38))
                                                (&deviceData->eventConfirmations,0,
                                                 deviceData->device_transport_ctx);
                                    }
                                    else {
                                      UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
                                      if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                                        iVar6 = 0x6a0;
                                        pcVar26 = "unexpected HTTP status code (%u)";
                                        goto LAB_0012be42;
                                      }
                                    }
                                  }
                                  else {
                                    pcVar26 = STRING_c_str(deviceData->deviceSasToken);
                                    HVar7 = HTTPHeaders_ReplaceHeaderNameValuePair
                                                      (pHVar19,"Authorization",pcVar26);
                                    if (HVar7 == HTTP_HEADERS_OK) {
                                      pHVar2 = *(HTTPAPIEX_HANDLE *)((long)handle + 8);
                                      pcVar26 = STRING_c_str(deviceData->eventHTTPrelativePath);
                                      HVar10 = HTTPAPIEX_ExecuteRequest
                                                         (pHVar2,HTTPAPI_REQUEST_POST,pcVar26,
                                                          pHVar19,pBVar20,(uint *)&source,
                                                          (HTTP_HEADERS_HANDLE)0x0,
                                                          (BUFFER_HANDLE)0x0);
                                      if (HVar10 == HTTPAPIEX_OK) goto LAB_0012bd27;
                                      UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
                                      if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                                        iVar6 = 0x68b;
                                        pcVar26 = "Unable to HTTPAPIEX_ExecuteRequest.";
                                        goto LAB_0012bdcb;
                                      }
LAB_0012bdd0:
                                      if (HVar10 == HTTPAPIEX_RECOVERYFAILED) {
                                        pDVar16 = DList_RemoveHeadList(deviceData->waitingToSend);
                                        DList_InsertTailList
                                                  (&deviceData->eventConfirmations,pDVar16);
                                        (**(code **)((long)handle + 0x38))
                                                  (&deviceData->eventConfirmations,3,
                                                   deviceData->device_transport_ctx);
                                      }
                                    }
                                    else {
                                      UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
                                      if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                                        iVar6 = 0x685;
                                        pcVar26 = "Unable to replace the old SAS Token.";
                                        goto LAB_0012be42;
                                      }
                                    }
                                  }
                                }
                                BUFFER_delete(pBVar20);
                                sVar12 = local_60;
                              }
                            }
                            else {
                              UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
                              if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                                pcVar26 = "set_system_properties";
                                iVar6 = 0x10d;
                                pcVar27 = 
                                "unable to HTTPHeaders_ReplaceHeaderNameValuePair (content-encoding)"
                                ;
                                goto LAB_0012b36f;
                              }
                            }
                          }
                          else {
                            UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
                            if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                              pcVar26 = "set_system_properties";
                              iVar6 = 0x108;
                              pcVar27 = 
                              "unable to HTTPHeaders_ReplaceHeaderNameValuePair (content-type)";
                              goto LAB_0012b36f;
                            }
                          }
                        }
                        else {
                          UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
                          if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                            iVar6 = 0x103;
                            goto LAB_0012b922;
                          }
                        }
                      }
                      else {
                        UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
                        sVar12 = local_60;
                        if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                          iVar6 = 0xfe;
LAB_0012b922:
                          pcVar26 = "set_system_properties";
                          pcVar27 = "unable to HTTPHeaders_ReplaceHeaderNameValuePair";
LAB_0012b36f:
                          (*UNRECOVERED_JUMPTABLE)
                                    (AZ_LOG_ERROR,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                                     ,pcVar26,iVar6,1,pcVar27);
                        }
                      }
                    }
                    else {
                      UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
                      if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                        iVar6 = 0x130;
                        pcVar26 = "unable to Map_GetInternals";
                        goto LAB_0012b516;
                      }
                    }
                  }
                }
                else {
                  UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
                  if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                    pcVar26 = "DoEvent";
                    iVar6 = 0x668;
                    pcVar27 = "HTTPHeaders_ReplaceHeaderNameValuePair failed";
                    goto LAB_0012b36f;
                  }
                }
LAB_0012b520:
                HTTPHeaders_Free(pHVar19);
              }
            }
            else {
              pDVar16 = DList_RemoveHeadList(deviceData->waitingToSend);
              DList_InsertTailList(&deviceData->eventConfirmations,pDVar16);
              (**(code **)((long)handle + 0x38))
                        (&deviceData->eventConfirmations,3,deviceData->device_transport_ctx);
            }
            goto LAB_0012af61;
          }
          UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
          if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
            iVar6 = 0x652;
            pcVar26 = "unable to get the message content";
LAB_0012af5c:
            (*UNRECOVERED_JUMPTABLE)
                      (AZ_LOG_ERROR,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                       ,"DoEvent",iVar6,1,pcVar26);
          }
        }
      }
LAB_0012af61:
      if ((deviceData->DoWork_PullMessage == true) &&
         ((stopTime = get_time((time_t *)0x0), stopTime == -1 || deviceData->isFirstPoll != false ||
          (dVar30 = get_difftime(stopTime,deviceData->lastPollTime),
          (double)*(uint *)((long)handle + 0x14) < dVar30)))) {
        pHVar19 = HTTPHeaders_Alloc();
        if (pHVar19 == (HTTP_HEADERS_HANDLE)0x0) {
          UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
          if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
            (*UNRECOVERED_JUMPTABLE)
                      (AZ_LOG_ERROR,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                       ,"DoMessages",0x77d,1,"unable to HTTPHeaders_Alloc");
          }
        }
        else {
          pBVar20 = BUFFER_new();
          if (pBVar20 == (BUFFER_HANDLE)0x0) {
            UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
            if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
              (*UNRECOVERED_JUMPTABLE)
                        (AZ_LOG_ERROR,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                         ,"DoMessages",0x784,1,"unable to BUFFER_new");
            }
          }
          else {
            propertiesSize = propertiesSize & 0xffffffff00000000;
            if (deviceData->deviceSasToken == (STRING_HANDLE)0x0) {
              pHVar3 = deviceData->sasObject;
              pHVar2 = *(HTTPAPIEX_HANDLE *)((long)handle + 8);
              pcVar26 = STRING_c_str(deviceData->messageHTTPrelativePath);
              sVar12 = local_60;
              pHVar31 = (HTTP_HEADERS_HANDLE)&propertiesSize;
              HVar10 = HTTPAPIEX_SAS_ExecuteRequest
                                 (pHVar3,pHVar2,HTTPAPI_REQUEST_GET,pcVar26,
                                  deviceData->messageHTTPrequestHeaders,(BUFFER_HANDLE)0x0,
                                  (uint *)pHVar31,pHVar19,pBVar20);
              if (HVar10 == HTTPAPIEX_OK) {
LAB_0012b13e:
                if (stopTime != -1) {
                  deviceData->lastPollTime = stopTime;
                }
                deviceData->isFirstPoll = stopTime == -1;
                if ((int)propertiesSize == 200) {
                  pcVar26 = HTTPHeaders_FindHeaderValue(pHVar19,"ETag");
                  if (pcVar26 == (char *)0x0) {
                    UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
                    if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                      iVar6 = 0x7c8;
                      pcVar26 = "unable to find a received header called \"E-Tag\"";
                      goto LAB_0012b3d5;
                    }
                  }
                  else {
                    sVar17 = strlen(pcVar26);
                    if (((sVar17 < 2) || (*pcVar26 != '\"')) || (pcVar26[sVar17 - 1] != '\"')) {
                      UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
                      if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                        iVar6 = 0x7d3;
                        pcVar26 = "ETag is not a valid quoted string";
                        goto LAB_0012b3d5;
                      }
                    }
                    else {
                      local_70 = pcVar26;
                      puVar21 = BUFFER_u_char(pBVar20);
                      sVar22 = BUFFER_length(pBVar20);
                      iotHubMessageHandle = IoTHubMessage_CreateFromByteArray(puVar21,sVar22);
                      if (iotHubMessageHandle == (IOTHUB_MESSAGE_HANDLE)0x0) {
                        UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
                        pcVar26 = local_70;
                        if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                          (*UNRECOVERED_JUMPTABLE)
                                    (AZ_LOG_ERROR,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                                     ,"DoMessages",0x7df,1,
                                     "unable to IoTHubMessage_CreateFromByteArray, trying to abandon the message... "
                                    );
                        }
                      }
                      else {
                        HVar7 = HTTPHeaders_GetHeaderCount(pHVar19,(size_t *)&source);
                        if (HVar7 == HTTP_HEADERS_OK) {
                          if (source == (uchar *)0x0) {
                            local_50 = (MAP_HANDLE)0x0;
                          }
                          else {
                            local_50 = IoTHubMessage_Properties(iotHubMessageHandle);
                          }
                          for (index_00 = (HTTP_HEADERS_HANDLE)0x0; index_00 < source;
                              index_00 = (HTTP_HEADERS_HANDLE)((long)&index_00->headers + 1)) {
                            HVar7 = HTTPHeaders_GetHeader(pHVar19,(size_t)index_00,(char **)&size);
                            sVar22 = size;
                            if (HVar7 != HTTP_HEADERS_OK) {
                              UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
                              pcVar26 = local_70;
                              if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                                iVar6 = 0x9d;
                                pcVar26 = "Failed getting header %lu";
LAB_0012bb53:
                                (*UNRECOVERED_JUMPTABLE)
                                          (AZ_LOG_ERROR,
                                           "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                                           ,"retrieve_message_properties",iVar6,1,pcVar26,index_00);
                                pcVar26 = local_70;
                              }
                              goto LAB_0012bbe2;
                            }
                            iVar6 = strncmp("iothub-app-",(char *)size,0xb);
                            if (iVar6 == 0) {
                              pcVar26 = strchr((char *)sVar22,0x3a);
                              if (pcVar26 != (char *)0x0) {
                                *pcVar26 = '\0';
                                MVar11 = Map_AddOrUpdate(local_50,(char *)(size + 0xb),pcVar26 + 2);
                                if (MVar11 != MAP_OK) {
LAB_0012bbd3:
                                  free((void *)size);
                                  pcVar26 = local_70;
                                  goto LAB_0012bbe2;
                                }
                              }
                            }
                            else {
                              iVar6 = strncmp("iothub-messageid",(char *)sVar22,0x10);
                              if (iVar6 == 0) {
                                pcVar26 = strchr((char *)sVar22,0x3a);
                                if (pcVar26 != (char *)0x0) {
                                  *pcVar26 = '\0';
                                  IVar9 = IoTHubMessage_SetMessageId
                                                    (iotHubMessageHandle,pcVar26 + 2);
LAB_0012baa4:
                                  if (IVar9 != IOTHUB_MESSAGE_OK) goto LAB_0012bbd3;
                                }
                              }
                              else {
                                iVar6 = strncmp("iothub-correlationid",(char *)sVar22,0x14);
                                if (iVar6 == 0) {
                                  pcVar26 = strchr((char *)sVar22,0x3a);
                                  if (pcVar26 != (char *)0x0) {
                                    *pcVar26 = '\0';
                                    IVar9 = IoTHubMessage_SetCorrelationId
                                                      (iotHubMessageHandle,pcVar26 + 2);
                                    goto LAB_0012baa4;
                                  }
                                }
                                else {
                                  iVar6 = strncmp("ContentType",(char *)sVar22,0xb);
                                  if (iVar6 == 0) {
                                    pcVar26 = strchr((char *)sVar22,0x3a);
                                    if (pcVar26 != (char *)0x0) {
                                      *pcVar26 = '\0';
                                      IVar9 = IoTHubMessage_SetContentTypeSystemProperty
                                                        (iotHubMessageHandle,pcVar26 + 2);
                                      if (IVar9 != IOTHUB_MESSAGE_OK) {
                                        UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
                                        pcVar26 = local_70;
                                        if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                                          iVar6 = 0xd8;
                                          pcVar26 = "Failed setting IoTHubMessage content-type";
                                          index_00 = pHVar31;
                                          goto LAB_0012bb53;
                                        }
                                        goto LAB_0012bbe2;
                                      }
                                    }
                                  }
                                  else {
                                    iVar6 = strncmp("ContentEncoding",(char *)sVar22,0xf);
                                    if ((iVar6 == 0) &&
                                       (pcVar26 = strchr((char *)sVar22,0x3a),
                                       pcVar26 != (char *)0x0)) {
                                      *pcVar26 = '\0';
                                      IVar9 = IoTHubMessage_SetContentEncodingSystemProperty
                                                        (iotHubMessageHandle,pcVar26 + 2);
                                      if (IVar9 != IOTHUB_MESSAGE_OK) {
                                        UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
                                        if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                                          (*UNRECOVERED_JUMPTABLE)
                                                    (AZ_LOG_ERROR,
                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                                                  ,"retrieve_message_properties",0xe6,1,
                                                  "Failed setting IoTHubMessage content-encoding");
                                        }
                                        break;
                                      }
                                    }
                                  }
                                }
                              }
                            }
                            free((void *)size);
                          }
                          dispositionContext = (MESSAGE_DISPOSITION_CONTEXT *)calloc(1,8);
                          if (dispositionContext == (MESSAGE_DISPOSITION_CONTEXT *)0x0) {
                            UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
                            if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                              (*UNRECOVERED_JUMPTABLE)
                                        (AZ_LOG_ERROR,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                                         ,"CreateMessageDispositionContext",0x766,1,"malloc failed")
                              ;
                            }
                          }
                          else {
                            iVar6 = mallocAndStrcpy_s((char **)dispositionContext,local_70);
                            if (iVar6 == 0) {
                              IVar9 = IoTHubMessage_SetDispositionContext
                                                (iotHubMessageHandle,dispositionContext,
                                                 DestroyMessageDispositionContext);
                              if (IVar9 == IOTHUB_MESSAGE_OK) {
                                cVar5 = (**(code **)((long)handle + 0x28))
                                                  (iotHubMessageHandle,
                                                   deviceData->device_transport_ctx);
                                if (cVar5 != '\0') goto LAB_0012b3da;
                                UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
                                pcVar26 = local_70;
                                if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                                  iVar6 = 0x7fc;
                                  pcVar27 = "IoTHubClientCore_LL_MessageCallback failed";
                                  goto LAB_0012bc0f;
                                }
                              }
                              else {
                                UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
                                if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                                  (*UNRECOVERED_JUMPTABLE)
                                            (AZ_LOG_ERROR,
                                             "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                                             ,"DoMessages",0x7f6,1,
                                             "Failed setting disposition context in IOTHUB_MESSAGE_HANDLE"
                                            );
                                }
                                DestroyMessageDispositionContext(dispositionContext);
                                pcVar26 = local_70;
                              }
                              goto LAB_0012bc14;
                            }
                            UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
                            if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                              (*UNRECOVERED_JUMPTABLE)
                                        (AZ_LOG_ERROR,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                                         ,"CreateMessageDispositionContext",0x76a,1,
                                         "mallocAndStrcpy_s failed");
                            }
                            free(dispositionContext);
                          }
                          UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
                          pcVar26 = local_70;
                          if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                            iVar6 = 0x7ef;
                            pcVar27 = "failed to create disposition context";
LAB_0012bc0f:
                            (*UNRECOVERED_JUMPTABLE)
                                      (AZ_LOG_ERROR,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                                       ,"DoMessages",iVar6,1,pcVar27);
                          }
                        }
                        else {
                          UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
                          pcVar26 = local_70;
                          if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                            (*UNRECOVERED_JUMPTABLE)
                                      (AZ_LOG_ERROR,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                                       ,"retrieve_message_properties",0x92,1,
                                       "unable to get the count of HTTP headers");
                          }
LAB_0012bbe2:
                          UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
                          if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                            iVar6 = 0x7e6;
                            pcVar27 = "Failed retrieving message properties";
                            goto LAB_0012bc0f;
                          }
                        }
LAB_0012bc14:
                        IoTHubMessage_Destroy(iotHubMessageHandle);
                      }
                      _Var4 = abandonOrAcceptMessage
                                        ((HTTPTRANSPORT_HANDLE_DATA *)handle,deviceData,pcVar26,
                                         IOTHUBMESSAGE_ABANDONED);
                      if ((!_Var4) &&
                         (UNRECOVERED_JUMPTABLE = xlogging_get_log_function(),
                         UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0)) {
                        iVar6 = 0x80f;
                        pcVar26 = "HTTP Transport layer failed to report ABANDON disposition";
                        goto LAB_0012b3d5;
                      }
                    }
                  }
                }
                else if (((int)propertiesSize != 0xcc) &&
                        (UNRECOVERED_JUMPTABLE = xlogging_get_log_function(),
                        UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0)) {
                  iVar6 = 0x7c1;
                  pcVar26 = 
                  "expected status code was 200, but actually was received %u... moving on";
LAB_0012b3d5:
                  (*UNRECOVERED_JUMPTABLE)
                            (AZ_LOG_ERROR,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                             ,"DoMessages",iVar6,1,pcVar26);
                }
              }
              else {
                UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
                if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                  iVar6 = 0x7ab;
                  pcVar26 = "unable to HTTPAPIEX_SAS_ExecuteRequest";
                  goto LAB_0012b3d5;
                }
              }
            }
            else {
              pHVar31 = deviceData->messageHTTPrequestHeaders;
              pcVar26 = STRING_c_str(deviceData->deviceSasToken);
              HVar7 = HTTPHeaders_ReplaceHeaderNameValuePair(pHVar31,"Authorization",pcVar26);
              if (HVar7 == HTTP_HEADERS_OK) {
                pHVar2 = *(HTTPAPIEX_HANDLE *)((long)handle + 8);
                pcVar26 = STRING_c_str(deviceData->messageHTTPrelativePath);
                pHVar31 = pHVar19;
                HVar10 = HTTPAPIEX_ExecuteRequest
                                   (pHVar2,HTTPAPI_REQUEST_GET,pcVar26,
                                    deviceData->messageHTTPrequestHeaders,(BUFFER_HANDLE)0x0,
                                    (uint *)&propertiesSize,pHVar19,pBVar20);
                if (HVar10 == HTTPAPIEX_OK) goto LAB_0012b13e;
                UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
                if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                  iVar6 = 0x79c;
                  pcVar26 = "Unable to HTTPAPIEX_ExecuteRequest.";
                  goto LAB_0012b3d5;
                }
              }
              else {
                UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
                if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                  iVar6 = 0x78f;
                  pcVar26 = "Unable to replace the old SAS Token.";
                  goto LAB_0012b3d5;
                }
              }
            }
LAB_0012b3da:
            BUFFER_delete(pBVar20);
          }
          HTTPHeaders_Free(pHVar19);
        }
      }
    }
  }
  return;
LAB_0012a703:
  do {
    iVar23 = iVar6;
    if ((!bVar24) ||
       (pDVar16 = deviceData->waitingToSend->Flink, pDVar16 == deviceData->waitingToSend)) {
      (*(code *)(&DAT_00177700 + *(int *)(&DAT_00177700 + (ulong)(iVar23 - 1) * 4)))();
      return;
    }
    IVar8 = IoTHubMessage_GetContentType((IOTHUB_MESSAGE_HANDLE)pDVar16[-2].Blink);
    if (IVar8 == IOTHUBMESSAGE_STRING) {
      pSVar14 = STRING_construct("{\"body\":");
      if (pSVar14 == (STRING_HANDLE)0x0) {
        UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
        if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
          iVar6 = 0x523;
LAB_0012a905:
          pcVar26 = "unable to STRING_construct";
          goto LAB_0012a910;
        }
        goto LAB_0012aa77;
      }
      pcVar26 = IoTHubMessage_GetString((IOTHUB_MESSAGE_HANDLE)pDVar16[-2].Blink);
      if (pcVar26 == (char *)0x0) {
        UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
        if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
          iVar6 = 0x52a;
          pcVar26 = "unable to IoTHubMessage_GetString";
LAB_0012aa6a:
          (*UNRECOVERED_JUMPTABLE)
                    (AZ_LOG_ERROR,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                     ,"make1EventJSONitem",iVar6,1,pcVar26);
        }
LAB_0012aa6f:
        STRING_delete(pSVar14);
        goto LAB_0012aa77;
      }
      s2 = STRING_new_JSON(pcVar26);
      if (s2 == (STRING_HANDLE)0x0) {
        UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
        if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
          iVar6 = 0x533;
          pcVar26 = "unable to STRING_new_JSON";
          goto LAB_0012aa6a;
        }
        goto LAB_0012aa6f;
      }
      source = (uchar *)0x0;
      iVar6 = STRING_concat_with_STRING(pSVar14,s2);
      if ((iVar6 != 0) || (iVar6 = STRING_concat(pSVar14,",\"base64Encoded\":false"), iVar6 != 0)) {
LAB_0012a842:
        UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
        if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
          (*UNRECOVERED_JUMPTABLE)
                    (AZ_LOG_ERROR,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                     ,"make1EventJSONitem",0x541,1,"unable to STRING_concat_with_STRING");
        }
        STRING_delete(pSVar14);
        goto LAB_0012a9cb;
      }
      pMVar15 = IoTHubMessage_Properties((IOTHUB_MESSAGE_HANDLE)pDVar16[-2].Blink);
      iVar6 = concat_Properties(pSVar14,pMVar15,(size_t *)&source);
      if ((iVar6 != 0) || (iVar6 = STRING_concat(pSVar14,"},"), iVar6 != 0)) goto LAB_0012a842;
      sVar17 = strlen(pcVar26);
      puVar21 = source;
LAB_0012abd6:
      local_50 = (MAP_HANDLE)(puVar21 + sVar17 + 0x180);
LAB_0012a9ce:
      STRING_delete(s2);
    }
    else {
      if (IVar8 == IOTHUBMESSAGE_BYTEARRAY) {
        pSVar14 = STRING_construct("{\"body\":\"");
        if (pSVar14 != (STRING_HANDLE)0x0) {
          IVar9 = IoTHubMessage_GetByteArray((IOTHUB_MESSAGE_HANDLE)pDVar16[-2].Blink,&source,&size)
          ;
          if (IVar9 == IOTHUB_MESSAGE_OK) {
            s2 = Azure_Base64_Encode_Bytes(source,size);
            if (s2 != (STRING_HANDLE)0x0) {
              propertiesSize = 0;
              iVar6 = STRING_concat_with_STRING(pSVar14,s2);
              if ((iVar6 == 0) && (iVar6 = STRING_concat(pSVar14,"\""), iVar6 == 0)) {
                pMVar15 = IoTHubMessage_Properties((IOTHUB_MESSAGE_HANDLE)pDVar16[-2].Blink);
                iVar6 = concat_Properties(pSVar14,pMVar15,&propertiesSize);
                if ((iVar6 == 0) &&
                   (iVar6 = STRING_concat(pSVar14,"},"), sVar17 = size,
                   puVar21 = (uchar *)propertiesSize, iVar6 == 0)) goto LAB_0012abd6;
              }
              STRING_delete(pSVar14);
              UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
              if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                (*UNRECOVERED_JUMPTABLE)
                          (AZ_LOG_ERROR,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                           ,"make1EventJSONitem",0x511,1,"unable to STRING_concat_with_STRING.");
              }
LAB_0012a9cb:
              pSVar14 = (STRING_HANDLE)0x0;
              goto LAB_0012a9ce;
            }
            UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
            if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
              iVar6 = 0x501;
              pcVar26 = "unable to Azure_Base64_Encode_Bytes.";
              goto LAB_0012aa6a;
            }
          }
          else {
            UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
            if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
              iVar6 = 0x4f8;
              pcVar26 = "unable to get the data for the message.";
              goto LAB_0012aa6a;
            }
          }
          goto LAB_0012aa6f;
        }
        UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
        if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
          iVar6 = 0x4ef;
          goto LAB_0012a905;
        }
      }
      else {
        UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
        if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
          iVar6 = 0x552;
          pcVar26 = "an unknown message type was encountered (%d)";
LAB_0012a910:
          (*UNRECOVERED_JUMPTABLE)
                    (AZ_LOG_ERROR,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                     ,"make1EventJSONitem",iVar6,1,pcVar26);
        }
      }
LAB_0012aa77:
      pSVar14 = (STRING_HANDLE)0x0;
    }
    if (!bVar28) break;
    if (pSVar14 != (STRING_HANDLE)0x0) {
      if ((MAP_HANDLE)0x3fbff < local_50) {
        pDVar16 = DList_RemoveHeadList(deviceData->waitingToSend);
        DList_InsertTailList(ListHead,pDVar16);
        STRING_delete(local_98);
        local_98 = (STRING_HANDLE)0x0;
        iVar23 = 4;
        goto LAB_0012ab54;
      }
      iVar6 = STRING_concat_with_STRING(local_98,pSVar14);
      if (iVar6 != 0) {
        STRING_delete(local_98);
        local_98 = (STRING_HANDLE)0x0;
        iVar23 = 3;
        goto LAB_0012ab54;
      }
      pDVar16 = DList_RemoveHeadList(deviceData->waitingToSend);
      DList_InsertTailList(ListHead,pDVar16);
      local_70 = (char *)((long)&local_50->keys + (long)local_70);
      bVar24 = true;
      goto LAB_0012ab57;
    }
    STRING_delete(local_98);
    local_98 = (STRING_HANDLE)0x0;
    bVar24 = false;
    bVar28 = false;
    iVar6 = 3;
  } while( true );
  bVar24 = false;
  bVar28 = false;
  iVar6 = 1;
  if (pSVar14 != (STRING_HANDLE)0x0) {
    uVar25 = (long)&local_50->keys + (long)local_70;
    if ((uVar25 < 0x3fc00) && (iVar6 = STRING_concat_with_STRING(local_98,pSVar14), iVar6 == 0)) {
      pDVar16 = DList_RemoveHeadList(deviceData->waitingToSend);
      DList_InsertTailList(ListHead,pDVar16);
      bVar24 = true;
      local_70 = (char *)uVar25;
    }
    else {
      iVar23 = 1;
LAB_0012ab54:
      bVar24 = false;
    }
LAB_0012ab57:
    STRING_delete(pSVar14);
    bVar28 = false;
    iVar6 = iVar23;
  }
  goto LAB_0012a703;
}

Assistant:

static void IoTHubTransportHttp_DoWork(TRANSPORT_LL_HANDLE handle)
{
    if (handle != NULL)
    {
        HTTPTRANSPORT_HANDLE_DATA* handleData = (HTTPTRANSPORT_HANDLE_DATA*)handle;
        IOTHUB_DEVICE_HANDLE* listItem;
        size_t deviceListSize = VECTOR_size(handleData->perDeviceList);
        for (size_t i = 0; i < deviceListSize; i++)
        {
            listItem = (IOTHUB_DEVICE_HANDLE *)VECTOR_element(handleData->perDeviceList, i);
            HTTPTRANSPORT_PERDEVICE_DATA* perDeviceItem = *(HTTPTRANSPORT_PERDEVICE_DATA**)(listItem);
            DoEvent(handleData, perDeviceItem);
            DoMessages(handleData, perDeviceItem);
        }
    }
    else
    {
        LogError("Invalid Argument NULL call on DoWork.");
    }
}